

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLock.cxx
# Opt level: O2

cmFileLock * __thiscall cmFileLock::operator=(cmFileLock *this,cmFileLock *other)

{
  this->File = other->File;
  other->File = -1;
  std::__cxx11::string::operator=((string *)&this->Filename,(string *)&other->Filename);
  return this;
}

Assistant:

cmFileLock& cmFileLock::operator=(cmFileLock&& other) noexcept
{
  this->File = other.File;
#if defined(_WIN32)
  other.File = INVALID_HANDLE_VALUE;
#else
  other.File = -1;
#endif
  this->Filename = std::move(other.Filename);

  return *this;
}